

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O1

bool __thiscall basisu::basis_compressor::validate_ktx2_constraints(basis_compressor *this)

{
  uint uVar1;
  basisu_backend_slice_desc *pbVar2;
  uint uVar3;
  ulong uVar4;
  char *__function;
  long lVar5;
  uint min_new_capacity;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  bool bVar10;
  vector<unsigned_int> total_mips;
  elemental_vector local_38;
  
  uVar4 = (ulong)(this->m_slice_descs).m_size;
  if (uVar4 == 0) {
    min_new_capacity = 0;
  }
  else {
    pbVar2 = (this->m_slice_descs).m_p;
    lVar5 = 0;
    min_new_capacity = 0;
    iVar6 = 0;
    iVar7 = 0;
    do {
      if (*(int *)((long)&pbVar2->m_mip_index + lVar5) == 0) {
        iVar8 = *(int *)((long)&pbVar2->m_orig_width + lVar5);
        if (iVar7 == 0) {
          iVar6 = *(int *)((long)&pbVar2->m_orig_height + lVar5);
        }
        else if ((iVar8 != iVar7) ||
                (iVar8 = iVar7, *(int *)((long)&pbVar2->m_orig_height + lVar5) != iVar6)) {
          return false;
        }
        uVar9 = *(int *)((long)&pbVar2->m_source_file_index + lVar5) + 1;
        iVar7 = iVar8;
        if (min_new_capacity <= uVar9) {
          min_new_capacity = uVar9;
        }
      }
      lVar5 = lVar5 + 0x30;
    } while (uVar4 * 0x30 != lVar5);
  }
  local_38.m_p = (int *)0x0;
  local_38.m_size = 0;
  local_38.m_capacity = 0;
  if (min_new_capacity != 0) {
    elemental_vector::increase_capacity
              (&local_38,min_new_capacity,min_new_capacity == 1,4,(object_mover)0x0,false);
    memset((int *)((long)local_38.m_p + (local_38._8_8_ & 0xffffffff) * 4),0,
           (ulong)(min_new_capacity - local_38.m_size) << 2);
    local_38.m_size = min_new_capacity;
  }
  uVar9 = (this->m_slice_descs).m_size;
  if (uVar9 != 0) {
    uVar3 = 0;
    lVar5 = 0x28;
    do {
      pbVar2 = (this->m_slice_descs).m_p;
      uVar1 = *(uint *)((long)pbVar2 + lVar5 + -4);
      if (local_38.m_size <= uVar1) goto LAB_0021a23b;
      if (uVar9 <= uVar3) {
        __function = 
        "T &basisu::vector<basisu::basisu_backend_slice_desc>::operator[](size_t) [T = basisu::basisu_backend_slice_desc]"
        ;
        goto LAB_0021a267;
      }
      uVar9 = *(int *)((long)&pbVar2->m_first_block_index + lVar5) + 1;
      if (uVar9 < *(uint *)((long)local_38.m_p + (ulong)uVar1 * 4)) {
        uVar9 = *(uint *)((long)local_38.m_p + (ulong)uVar1 * 4);
      }
      *(uint *)((long)local_38.m_p + (ulong)uVar1 * 4) = uVar9;
      uVar3 = uVar3 + 1;
      uVar9 = (this->m_slice_descs).m_size;
      lVar5 = lVar5 + 0x30;
    } while (uVar3 < uVar9);
  }
  bVar10 = min_new_capacity < 2;
  if (!bVar10) {
    if (local_38.m_size == 0) {
LAB_0021a23b:
      __function = "T &basisu::vector<unsigned int>::operator[](size_t) [T = unsigned int]";
LAB_0021a267:
      __assert_fail("i < m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                    ,0x178,__function);
    }
    lVar5 = 0;
    do {
      if (local_38.m_size - 1 == (int)lVar5) goto LAB_0021a23b;
      if (*local_38.m_p != *(int *)((long)local_38.m_p + (lVar5 + 1) * 4)) break;
      bVar10 = min_new_capacity <= (int)lVar5 + 2U;
      lVar5 = lVar5 + 1;
    } while (min_new_capacity - 1 != (int)lVar5);
  }
  if ((int *)local_38.m_p != (int *)0x0) {
    free(local_38.m_p);
  }
  return bVar10;
}

Assistant:

bool basis_compressor::validate_ktx2_constraints()
	{
		uint32_t base_width = 0, base_height = 0;
		uint32_t total_layers = 0;
		for (uint32_t i = 0; i < m_slice_descs.size(); i++)
		{
			if (m_slice_descs[i].m_mip_index == 0)
			{
				if (!base_width)
				{
					base_width = m_slice_descs[i].m_orig_width;
					base_height = m_slice_descs[i].m_orig_height;
				}
				else
				{
					if ((m_slice_descs[i].m_orig_width != base_width) || (m_slice_descs[i].m_orig_height != base_height))
					{
						return false;
					}
				}

				total_layers = maximum<uint32_t>(total_layers, m_slice_descs[i].m_source_file_index + 1);
			}
		}

		basisu::vector<uint32_t> total_mips(total_layers);
		for (uint32_t i = 0; i < m_slice_descs.size(); i++)
			total_mips[m_slice_descs[i].m_source_file_index] = maximum<uint32_t>(total_mips[m_slice_descs[i].m_source_file_index], m_slice_descs[i].m_mip_index + 1);

		for (uint32_t i = 1; i < total_layers; i++)
		{
			if (total_mips[0] != total_mips[i])
			{
				return false;
			}
		}

		return true;
	}